

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inputlag.c
# Opt level: O3

void sample_input(GLFWwindow *window)

{
  nk_vec2 nVar1;
  double y;
  double x;
  double local_20;
  double local_18;
  
  if (cursor_method == NK_DO_NOT_STOP_ON_NEW_LINE) {
    glfwGetCursorPos(window,&local_18,&local_20);
    cursor_new.x = (float)local_18;
    cursor_new.y = (float)local_20;
  }
  nVar1.x = (cursor_new.x - cursor_pos.x) * 0.25 + cursor_vel.x * 0.75;
  nVar1.y = (cursor_new.y - cursor_pos.y) * 0.25 + cursor_vel.y * 0.75;
  cursor_vel = nVar1;
  cursor_pos = cursor_new;
  return;
}

Assistant:

void sample_input(GLFWwindow* window)
{
    float a = .25; // exponential smoothing factor

    if (cursor_method == cursor_sync_query) {
        double x, y;
        glfwGetCursorPos(window, &x, &y);
        cursor_new.x = (float) x;
        cursor_new.y = (float) y;
    }

    cursor_vel.x = (cursor_new.x - cursor_pos.x) * a + cursor_vel.x * (1 - a);
    cursor_vel.y = (cursor_new.y - cursor_pos.y) * a + cursor_vel.y * (1 - a);
    cursor_pos = cursor_new;
}